

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Parser * GetParserForNode(TidyDocImpl *doc,Node *node)

{
  long lVar1;
  Parser *pPVar2;
  long in_RDX;
  
  if ((int)node != 0) {
    return ParseXMLElement;
  }
  if ((in_RDX != 0) && (lVar1 = *(long *)(in_RDX + 0x38), lVar1 != 0)) {
    if ((*(uint *)(lVar1 + 0x20) & 1) == 0) {
      if ((*(uint *)(lVar1 + 0x20) & 0x10) == 0) {
        *(undefined4 *)&(doc->root).next = 0;
      }
    }
    else {
      *(undefined4 *)&(doc->root).prev = 0;
      if (*(long *)(lVar1 + 0x28) == 0) {
        return (Parser *)0x0;
      }
    }
    pPVar2 = *(Parser **)(lVar1 + 0x28);
    if ((pPVar2 != (Parser *)0x0) && (*(int *)(in_RDX + 0x50) != 7)) {
      (doc->root).column = (int)in_RDX;
      (doc->root).idx = (int)((ulong)in_RDX >> 0x20);
      return pPVar2;
    }
  }
  return (Parser *)0x0;
}

Assistant:

static Parser* GetParserForNode( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    if ( cfgBool( doc, TidyXmlTags ) )
        return ParseXMLElement;
    
    /* [i_a]2 prevent crash for active content (php, asp) docs */
    if (!node || node->tag == NULL)
        return NULL;

    /*
       Fix by GLP 2000-12-21.  Need to reset insertspace if this is both
       a non-inline and empty tag (base, link, meta, isindex, hr, area).
    */
    if (node->tag->model & CM_EMPTY)
    {
        lexer->waswhite = no;
        if (node->tag->parser == NULL)
            return NULL;
    }
    else if (!(node->tag->model & CM_INLINE))
        lexer->insertspace = no;

    if (node->tag->parser == NULL)
        return NULL;

    if (node->type == StartEndTag)
        return NULL;

    /* [i_a]2 added this - not sure why - CHECKME: */
    lexer->parent = node;

    return (node->tag->parser);
}